

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O1

int __thiscall ncnn::Normalize::forward_inplace(Normalize *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  Allocator *pAVar6;
  void *pvVar7;
  void *pvVar8;
  float *pfVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float *pfVar14;
  uint uVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Mat square_sum_blob;
  void *ptr;
  void *local_78;
  void *local_38;
  
  uVar2 = bottom_top_blob->c;
  uVar16 = (ulong)uVar2;
  uVar15 = bottom_top_blob->h * bottom_top_blob->w;
  iVar10 = this->across_spatial;
  iVar3 = this->across_channel;
  if (iVar3 == 0 || iVar10 == 0) {
    if (iVar10 == 0 || iVar3 != 0) {
      if (iVar3 != 0 && iVar10 == 0) {
        pAVar6 = opt->workspace_allocator;
        local_78 = (void *)0x0;
        piVar1 = (int *)0x0;
        if (uVar15 != 0) {
          uVar12 = bottom_top_blob->elemsize * (long)(int)uVar15 + 3 & 0xfffffffffffffffc;
          if (pAVar6 == (Allocator *)0x0) {
            local_38 = (void *)0x0;
            iVar10 = posix_memalign(&local_38,0x10,uVar12 + 4);
            local_78 = local_38;
            if (iVar10 != 0) {
              local_38 = (void *)0x0;
              local_78 = local_38;
            }
          }
          else {
            local_78 = (void *)(**(code **)(*(long *)pAVar6 + 0x10))(pAVar6,uVar12 + 4);
          }
          piVar1 = (int *)((long)local_78 + uVar12);
          *(undefined4 *)((long)local_78 + uVar12) = 1;
        }
        iVar10 = -100;
        if ((local_78 != (void *)0x0) && ((long)(int)uVar15 != 0)) {
          if (this->channel_shared == 0) {
            if (0 < (int)uVar15) {
              pfVar9 = (float *)bottom_top_blob->data;
              sVar4 = bottom_top_blob->cstep;
              iVar10 = this->eps_mode;
              sVar5 = bottom_top_blob->elemsize;
              uVar12 = 0;
              do {
                fVar17 = 0.0;
                uVar13 = uVar16;
                pfVar14 = pfVar9;
                if (0 < (int)uVar2) {
                  do {
                    fVar17 = fVar17 + *pfVar14 * *pfVar14;
                    uVar13 = uVar13 - 1;
                    pfVar14 = (float *)((long)pfVar14 + sVar4 * sVar5);
                  } while (uVar13 != 0);
                }
                if (iVar10 == 0) {
                  fVar17 = fVar17 + this->eps;
LAB_0017959d:
                  fVar18 = SQRT(fVar17);
                }
                else {
                  if (iVar10 != 1) {
                    if (fVar17 <= this->eps) {
                      fVar17 = this->eps;
                    }
                    goto LAB_0017959d;
                  }
                  fVar18 = SQRT(fVar17);
                  if (SQRT(fVar17) <= this->eps) {
                    fVar18 = this->eps;
                  }
                }
                *(float *)((long)local_78 + uVar12 * 4) = 1.0 / fVar18;
                uVar12 = uVar12 + 1;
                pfVar9 = pfVar9 + 1;
              } while (uVar12 != uVar15);
            }
            if (0 < (int)uVar2) {
              pvVar8 = bottom_top_blob->data;
              sVar4 = bottom_top_blob->cstep;
              pvVar7 = (this->scale_data).data;
              sVar5 = bottom_top_blob->elemsize;
              uVar12 = 0;
              do {
                if (0 < (int)uVar15) {
                  fVar17 = *(float *)((long)pvVar7 + uVar12 * 4);
                  uVar13 = 0;
                  do {
                    *(float *)((long)pvVar8 + uVar13 * 4) =
                         *(float *)((long)pvVar8 + uVar13 * 4) * fVar17 *
                         *(float *)((long)local_78 + uVar13 * 4);
                    uVar13 = uVar13 + 1;
                  } while (uVar15 != uVar13);
                }
                uVar12 = uVar12 + 1;
                pvVar8 = (void *)((long)pvVar8 + sVar4 * sVar5);
              } while (uVar12 != uVar16);
            }
          }
          else {
            if (0 < (int)uVar15) {
              fVar17 = *(this->scale_data).data;
              pfVar9 = (float *)bottom_top_blob->data;
              sVar4 = bottom_top_blob->cstep;
              iVar10 = this->eps_mode;
              sVar5 = bottom_top_blob->elemsize;
              uVar12 = 0;
              do {
                fVar18 = 0.0;
                uVar13 = uVar16;
                pfVar14 = pfVar9;
                if (0 < (int)uVar2) {
                  do {
                    fVar18 = fVar18 + *pfVar14 * *pfVar14;
                    uVar13 = uVar13 - 1;
                    pfVar14 = (float *)((long)pfVar14 + sVar4 * sVar5);
                  } while (uVar13 != 0);
                }
                if (iVar10 == 0) {
                  fVar18 = fVar18 + this->eps;
LAB_001794b7:
                  fVar19 = SQRT(fVar18);
                }
                else {
                  if (iVar10 != 1) {
                    if (fVar18 <= this->eps) {
                      fVar18 = this->eps;
                    }
                    goto LAB_001794b7;
                  }
                  fVar19 = SQRT(fVar18);
                  if (SQRT(fVar18) <= this->eps) {
                    fVar19 = this->eps;
                  }
                }
                *(float *)((long)local_78 + uVar12 * 4) = fVar17 / fVar19;
                uVar12 = uVar12 + 1;
                pfVar9 = pfVar9 + 1;
              } while (uVar12 != uVar15);
            }
            if (0 < (int)uVar2) {
              sVar4 = bottom_top_blob->cstep;
              sVar5 = bottom_top_blob->elemsize;
              pvVar8 = bottom_top_blob->data;
              uVar12 = 0;
              do {
                if (0 < (int)uVar15) {
                  uVar13 = 0;
                  do {
                    *(float *)((long)pvVar8 + uVar13 * 4) =
                         *(float *)((long)local_78 + uVar13 * 4) *
                         *(float *)((long)pvVar8 + uVar13 * 4);
                    uVar13 = uVar13 + 1;
                  } while (uVar15 != uVar13);
                }
                uVar12 = uVar12 + 1;
                pvVar8 = (void *)((long)pvVar8 + sVar4 * sVar5);
              } while (uVar12 != uVar16);
            }
          }
          iVar10 = 0;
        }
        if (piVar1 == (int *)0x0) {
          return iVar10;
        }
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 != 0) {
          return iVar10;
        }
        if (pAVar6 != (Allocator *)0x0) {
          (**(code **)(*(long *)pAVar6 + 0x18))();
          return iVar10;
        }
        if (local_78 == (void *)0x0) {
          return iVar10;
        }
        free(local_78);
        return iVar10;
      }
    }
    else if (0 < (int)uVar2) {
      pvVar8 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->cstep;
      iVar10 = this->channel_shared;
      iVar3 = this->eps_mode;
      sVar5 = bottom_top_blob->elemsize;
      uVar12 = 0;
      do {
        fVar17 = 0.0;
        if (0 < (int)uVar15) {
          uVar13 = 0;
          do {
            fVar18 = *(float *)((long)pvVar8 + uVar13 * 4);
            fVar17 = fVar17 + fVar18 * fVar18;
            uVar13 = uVar13 + 1;
          } while (uVar15 != uVar13);
        }
        if (iVar3 == 0) {
          fVar17 = fVar17 + this->eps;
LAB_00178f2f:
          fVar18 = SQRT(fVar17);
        }
        else {
          if (iVar3 != 1) {
            if (fVar17 <= this->eps) {
              fVar17 = this->eps;
            }
            goto LAB_00178f2f;
          }
          fVar18 = SQRT(fVar17);
          if (SQRT(fVar17) <= this->eps) {
            fVar18 = this->eps;
          }
        }
        if (0 < (int)uVar15) {
          uVar13 = uVar12 & 0xffffffff;
          if (iVar10 != 0) {
            uVar13 = 0;
          }
          fVar17 = *(float *)((long)(this->scale_data).data + uVar13 * 4);
          uVar13 = 0;
          do {
            *(float *)((long)pvVar8 + uVar13 * 4) =
                 *(float *)((long)pvVar8 + uVar13 * 4) * fVar17 * (1.0 / fVar18);
            uVar13 = uVar13 + 1;
          } while (uVar15 != uVar13);
        }
        uVar12 = uVar12 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar4 * sVar5);
      } while (uVar12 != uVar16);
    }
    return 0;
  }
  pAVar6 = opt->workspace_allocator;
  local_78 = (void *)0x0;
  piVar1 = (int *)0x0;
  if (uVar2 != 0) {
    uVar12 = bottom_top_blob->elemsize * (long)(int)uVar2 + 3 & 0xfffffffffffffffc;
    if (pAVar6 == (Allocator *)0x0) {
      local_38 = (void *)0x0;
      iVar10 = posix_memalign(&local_38,0x10,uVar12 + 4);
      local_78 = local_38;
      if (iVar10 != 0) {
        local_38 = (void *)0x0;
        local_78 = local_38;
      }
    }
    else {
      local_78 = (void *)(**(code **)(*(long *)pAVar6 + 0x10))();
    }
    piVar1 = (int *)((long)local_78 + uVar12);
    *(undefined4 *)((long)local_78 + uVar12) = 1;
  }
  iVar10 = -100;
  if ((local_78 == (void *)0x0) || ((long)(int)uVar2 == 0)) goto LAB_001792d8;
  uVar12 = (ulong)uVar15;
  if (0 < (int)uVar2) {
    pvVar8 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->cstep;
    sVar5 = bottom_top_blob->elemsize;
    uVar13 = 0;
    do {
      fVar17 = 0.0;
      if (0 < (int)uVar15) {
        uVar11 = 0;
        do {
          fVar18 = *(float *)((long)pvVar8 + uVar11 * 4);
          fVar17 = fVar17 + fVar18 * fVar18;
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      *(float *)((long)local_78 + uVar13 * 4) = fVar17;
      uVar13 = uVar13 + 1;
      pvVar8 = (void *)((long)pvVar8 + sVar4 * sVar5);
    } while (uVar13 != uVar16);
  }
  fVar17 = 0.0;
  if (0 < (int)uVar2) {
    uVar13 = 0;
    do {
      fVar17 = fVar17 + *(float *)((long)local_78 + uVar13 * 4);
      uVar13 = uVar13 + 1;
    } while (uVar16 != uVar13);
  }
  if (this->eps_mode == 0) {
    fVar17 = fVar17 + this->eps;
LAB_00179220:
    fVar18 = SQRT(fVar17);
  }
  else {
    if (this->eps_mode != 1) {
      if (fVar17 <= this->eps) {
        fVar17 = this->eps;
      }
      goto LAB_00179220;
    }
    fVar18 = SQRT(fVar17);
    if (SQRT(fVar17) <= this->eps) {
      fVar18 = this->eps;
    }
  }
  if (this->channel_shared == 0) {
    if (0 < (int)uVar2) {
      pvVar8 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->cstep;
      sVar5 = bottom_top_blob->elemsize;
      pvVar7 = (this->scale_data).data;
      uVar13 = 0;
      do {
        if (0 < (int)uVar15) {
          fVar17 = *(float *)((long)pvVar7 + uVar13 * 4);
          uVar11 = 0;
          do {
            *(float *)((long)pvVar8 + uVar11 * 4) =
                 *(float *)((long)pvVar8 + uVar11 * 4) * fVar17 * (1.0 / fVar18);
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
        uVar13 = uVar13 + 1;
        pvVar8 = (void *)((long)pvVar8 + sVar4 * sVar5);
      } while (uVar13 != uVar16);
    }
  }
  else if (0 < (int)uVar2) {
    fVar17 = *(this->scale_data).data;
    pvVar8 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->cstep;
    sVar5 = bottom_top_blob->elemsize;
    uVar13 = 0;
    do {
      if (0 < (int)uVar15) {
        uVar11 = 0;
        do {
          *(float *)((long)pvVar8 + uVar11 * 4) =
               *(float *)((long)pvVar8 + uVar11 * 4) * (1.0 / fVar18) * fVar17;
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      uVar13 = uVar13 + 1;
      pvVar8 = (void *)((long)pvVar8 + sVar4 * sVar5);
    } while (uVar13 != uVar16);
  }
  iVar10 = 0;
LAB_001792d8:
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (pAVar6 == (Allocator *)0x0) {
        if (local_78 != (void *)0x0) {
          free(local_78);
        }
      }
      else {
        (**(code **)(*(long *)pAVar6 + 0x18))();
      }
    }
  }
  return iVar10;
}

Assistant:

int Normalize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        float ssum = 0.f;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        float a;
        if (eps_mode == 0) // caffe/mxnet
        {
            a = static_cast<float>(1.f / sqrt(ssum + eps));
        }
        else if (eps_mode == 1) // pytorch
        {
            a = 1.f / std::max((float)sqrt(ssum), eps);
        }
        else //if (eps_mode == 2) // tensorflow
        {
            a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
        }

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a;
            if (eps_mode == 0) // caffe/mxnet
            {
                a = static_cast<float>(1.f / sqrt(ssum + eps));
            }
            else if (eps_mode == 1) // pytorch
            {
                a = 1.f / std::max((float)sqrt(ssum), eps);
            }
            else //if (eps_mode == 2) // tensorflow
            {
                a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
            }

            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = 0.f;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = static_cast<float>(1.f / sqrt(ssum + eps));
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
                }

                square_sum_blob[i] = a * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = 0.f;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = static_cast<float>(1.f / sqrt(ssum + eps));
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
                }

                square_sum_blob[i] = a;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}